

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall
wasm::FunctionValidator::validateCallParamsAndResult<wasm::Call>
          (FunctionValidator *this,Call *curr,HeapType sigType,Expression *printable)

{
  Type TVar1;
  Function *pFVar2;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar3;
  bool bVar4;
  size_t sVar5;
  Type *pTVar6;
  Expression **ppEVar7;
  ostream *poVar8;
  undefined1 auVar9 [8];
  size_t sVar10;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar11;
  Signature SVar12;
  undefined1 local_70 [8];
  Signature sig;
  HeapType sigType_local;
  undefined1 local_48 [8];
  Iterator __begin2;
  
  sig.results.id = sigType.id;
  bVar4 = HeapType::isSignature((HeapType *)&sig.results);
  bVar4 = shouldBeTrue<wasm::Expression*>(this,bVar4,printable,"Heap type must be a signature type")
  ;
  if (bVar4) {
    _local_70 = HeapType::getSignature((HeapType *)&sig.results);
    sVar10 = (curr->operands).
             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
    ;
    sVar5 = wasm::Type::size((Type *)local_70);
    bVar4 = shouldBeTrue<wasm::Expression*>
                      (this,sVar10 == sVar5,printable,"call* param number must match");
    if (bVar4) {
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)0x0;
      local_48 = (undefined1  [8])local_70;
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
           (size_t)printable;
      PVar11 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
               wasm::Type::end((Type *)local_70);
      sVar10 = 0;
      pTVar6 = (Type *)0x0;
      auVar9 = (undefined1  [8])local_70;
      while (sVar5 = __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     index, PVar3.index = (size_t)pTVar6, PVar3.parent = (Type *)auVar9,
            PVar11 != PVar3) {
        pTVar6 = wasm::Type::Iterator::operator*((Iterator *)local_48);
        ppEVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                            (&(curr->operands).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                             ,sVar10);
        bVar4 = shouldBeSubType(this,(Type)((*ppEVar7)->type).id,(Type)pTVar6->id,
                                (Expression *)
                                __begin2.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                                index,"call param types must match");
        if ((!bVar4) && (this->info->quiet == false)) {
          poVar8 = getStream(this);
          poVar8 = std::operator<<(poVar8,"(on argument ");
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
          std::operator<<(poVar8,")\n");
        }
        sVar10 = sVar10 + 1;
        pTVar6 = (Type *)((long)&(__begin2.
                                  super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                 .parent)->id + 1);
        auVar9 = local_48;
        __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = pTVar6
        ;
      }
      TVar1.id = (curr->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.type.id;
      if (curr->isReturn == false) {
        shouldBeEqualOrFirstIsUnreachable<wasm::Expression*,wasm::Type>
                  (this,TVar1,sig.params,
                   (Expression *)
                   __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                   index,"call* type must match callee return type");
      }
      else {
        shouldBeEqual<wasm::Expression*,wasm::Type>
                  (this,TVar1,(Type)0x1,
                   (Expression *)
                   __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                   index,"return_call* should have unreachable type");
        pFVar2 = (this->
                 super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                 ).
                 super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                 .
                 super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                 .currFunction;
        bVar4 = shouldBeTrue<wasm::Call*>
                          (this,pFVar2 != (Function *)0x0,curr,"function not defined");
        if (bVar4) {
          TVar1.id = sig.params.id;
          SVar12 = HeapType::getSignature(&pFVar2->type);
          shouldBeSubType(this,TVar1,SVar12.results.id,(Expression *)sVar5,
                          "return_call* callee return type must match caller return type");
        }
      }
    }
  }
  return;
}

Assistant:

void validateCallParamsAndResult(T* curr,
                                   HeapType sigType,
                                   Expression* printable) {
    if (!shouldBeTrue(sigType.isSignature(),
                      printable,
                      "Heap type must be a signature type")) {
      return;
    }
    auto sig = sigType.getSignature();
    if (!shouldBeTrue(curr->operands.size() == sig.params.size(),
                      printable,
                      "call* param number must match")) {
      return;
    }
    size_t i = 0;
    for (const auto& param : sig.params) {
      if (!shouldBeSubType(curr->operands[i]->type,
                           param,
                           printable,
                           "call param types must match") &&
          !info.quiet) {
        getStream() << "(on argument " << i << ")\n";
      }
      ++i;
    }
    if (curr->isReturn) {
      shouldBeEqual(curr->type,
                    Type(Type::unreachable),
                    printable,
                    "return_call* should have unreachable type");
      auto* func = getFunction();
      if (!shouldBeTrue(!!func, curr, "function not defined")) {
        return;
      }
      shouldBeSubType(
        sig.results,
        func->getResults(),
        printable,
        "return_call* callee return type must match caller return type");
    } else {
      shouldBeEqualOrFirstIsUnreachable(
        curr->type,
        sig.results,
        printable,
        "call* type must match callee return type");
    }
  }